

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall cs::compiler_type::try_fix_this_deduction(compiler_type *this,iterator it)

{
  token_base *ptVar1;
  bool bVar2;
  bool bVar3;
  signal_types sVar4;
  token_base **pptVar5;
  var_id *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  iterator this_00;
  string *str;
  token_id *id;
  token_signal *sig;
  char *in_stack_fffffffffffffec8;
  any *in_stack_fffffffffffffed0;
  token_id *local_108;
  token_signal *local_f8;
  iterator *in_stack_ffffffffffffff10;
  token_base *this_01;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined1 uVar7;
  allocator local_c1;
  string local_c0 [96];
  tree_node *local_60;
  tree_node *local_58;
  tree_node *local_50;
  tree_node *local_48;
  tree_node *local_40;
  tree_node *local_38;
  iterator local_30;
  tree_node *local_28;
  token_id *local_20;
  token_signal *local_18;
  iterator local_8;
  
  bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_8);
  if (bVar2) {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff10);
    this_01 = *pptVar5;
    if (this_01 == (token_base *)0x0) {
      local_f8 = (token_signal *)0x0;
    }
    else {
      local_f8 = (token_signal *)
                 __dynamic_cast(this_01,&token_base::typeinfo,&token_signal::typeinfo,0);
    }
    local_18 = local_f8;
    if ((local_f8 != (token_signal *)0x0) &&
       (sVar4 = token_signal::get_signal(local_f8), sVar4 == dot_)) {
      local_28 = (tree_node *)
                 tree_type<cs::token_base_*>::iterator::left
                           ((iterator *)
                            CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
      if (*pptVar5 == (token_base *)0x0) {
        local_108 = (token_id *)0x0;
      }
      else {
        local_108 = (token_id *)__dynamic_cast(*pptVar5,&token_base::typeinfo,&token_id::typeinfo,0)
        ;
      }
      local_20 = local_108;
      if (local_108 != (token_id *)0x0) {
        pvVar6 = token_id::get_id(local_108);
        var_id::get_id_abi_cxx11_(pvVar6);
        bVar2 = std::operator!=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (!bVar2) {
          local_38 = (tree_node *)
                     tree_type<cs::token_base_*>::iterator::left
                               ((iterator *)
                                CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
          local_30 = tree_type<cs::token_base_*>::iterator::left
                               ((iterator *)
                                CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
          bVar3 = tree_type<cs::token_base_*>::iterator::usable(&local_30);
          bVar2 = false;
          if (bVar3) {
            local_48 = (tree_node *)
                       tree_type<cs::token_base_*>::iterator::left
                                 ((iterator *)
                                  CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
            local_40 = (tree_node *)
                       tree_type<cs::token_base_*>::iterator::left
                                 ((iterator *)
                                  CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
            pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
            bVar2 = false;
            if (*pptVar5 != (token_base *)0x0) {
              local_58 = (tree_node *)
                         tree_type<cs::token_base_*>::iterator::left
                                   ((iterator *)
                                    CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
              local_50 = (tree_node *)
                         tree_type<cs::token_base_*>::iterator::left
                                   ((iterator *)
                                    CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
              pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
              ptVar1 = *pptVar5;
              local_60 = (tree_node *)
                         tree_type<cs::token_base_*>::iterator::right
                                   ((iterator *)
                                    CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
              pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
              bVar2 = ptVar1 == *pptVar5;
            }
          }
          if (bVar2) {
            uVar7 = 1;
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_c0,"Symbol collision with structure member \"",&local_c1);
            this_00 = tree_type<cs::token_base_*>::iterator::right
                                ((iterator *)CONCAT17(uVar7,in_stack_ffffffffffffff18));
            str = (string *)tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
            pvVar6 = token_id::get_id((token_id *)str->mDat);
            var_id::get_id_abi_cxx11_(pvVar6);
            std::operator+((any *)__lhs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00.mData);
            std::operator+(__lhs,(char *)this_00.mData);
            compile_error::compile_error((compile_error *)this_00.mData,str);
            __cxa_throw(__lhs,&compile_error::typeinfo,compile_error::~compile_error);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void compiler_type::try_fix_this_deduction(cs::tree_type<cs::token_base *>::iterator it)
	{
		if (!it.usable())
			return;
		token_signal *sig = dynamic_cast<token_signal *>(it.data());
		if (sig == nullptr || sig->get_signal() != signal_types::dot_)
			return;
		token_id *id = dynamic_cast<token_id *>(it.left().data());
		if (id == nullptr || id->get_id().get_id() != "this")
			return;
		// Check if it was generated by AST trimmer
		if (it.left().left().usable() && it.left().left().data() != nullptr &&
		        it.left().left().data() == it.right().data()) {
			// it.data() = it.right().data();
			throw compile_error(std::string("Symbol collision with structure member \"") +
			                    static_cast<token_id *>(it.right().data())->get_id().get_id() + "\".");
		}
	}